

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

ssize_t __thiscall Corrade::Utility::Path::write(Path *this,int __fd,void *__buf,size_t __n)

{
  StringView value;
  char *__filename;
  FILE *handle;
  Debug *pDVar1;
  int *piVar2;
  undefined8 extraout_RAX;
  void *__ptr;
  size_t __n_00;
  undefined8 extraout_RAX_00;
  undefined8 uVar3;
  undefined4 in_register_00000034;
  StringView view;
  undefined1 local_d0 [8];
  ScopeGuard exit;
  Flags local_a1;
  undefined1 local_a0 [8];
  Error err;
  String local_50;
  FILE *local_38;
  FILE *f;
  ArrayView<const_void> data_local;
  StringView filename_local;
  
  view._sizePlusFlags = __n;
  view._data = (char *)CONCAT44(in_register_00000034,__fd);
  f = (FILE *)__buf;
  data_local._data = (void *)__n;
  data_local._size = (size_t)this;
  Containers::String::nullTerminatedView(&local_50,(String *)this,view);
  __filename = Containers::String::data(&local_50);
  handle = fopen(__filename,"wb");
  Containers::String::~String(&local_50);
  local_38 = handle;
  if (handle != (FILE *)0x0) {
    Containers::ScopeGuard::ScopeGuard<_IO_FILE*,int(*)(_IO_FILE*)>
              ((ScopeGuard *)local_d0,(_IO_FILE *)handle,fclose);
    __ptr = Containers::ArrayView::operator_cast_to_void_((ArrayView *)&f);
    __n_00 = Containers::ArrayView<const_void>::size((ArrayView<const_void> *)&f);
    fwrite(__ptr,1,__n_00,local_38);
    Containers::ScopeGuard::~ScopeGuard((ScopeGuard *)local_d0);
    uVar3 = extraout_RAX_00;
  }
  else {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_a1);
    Error::Error((Error *)local_a0,local_a1);
    pDVar1 = Debug::operator<<((Debug *)local_a0,"Utility::Path::write(): can\'t open");
    exit._handle = (void *)data_local._size;
    value._sizePlusFlags = (size_t)CONCAT44(in_register_00000034,__fd);
    value._data = (char *)data_local._size;
    pDVar1 = Debug::operator<<(pDVar1,value);
    pDVar1 = Debug::operator<<(pDVar1,Debug::nospace);
    Debug::operator<<(pDVar1,":");
    piVar2 = __errno_location();
    Implementation::printErrnoErrorString((Debug *)local_a0,*piVar2);
    Error::~Error((Error *)local_a0);
    uVar3 = extraout_RAX;
  }
  return CONCAT71((int7)((ulong)uVar3 >> 8),handle != (FILE *)0x0);
}

Assistant:

bool write(const Containers::StringView filename, const Containers::ArrayView<const void> data) {
    /* Special case for "Unicode" Windows support */
    #ifndef CORRADE_TARGET_WINDOWS
    std::FILE* const f = std::fopen(Containers::String::nullTerminatedView(filename).data(), "wb");
    #else
    std::FILE* const f = _wfopen(Unicode::widen(filename), L"wb");
    #endif
    if(!f) {
        Error err;
        err << "Utility::Path::write(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printErrnoErrorString(err, errno);
        return false;
    }

    Containers::ScopeGuard exit{f, std::fclose};

    std::fwrite(data, 1, data.size(), f);
    return true;
}